

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.hpp
# Opt level: O1

bool __thiscall StructType::has_field(StructType *this,string *field_name)

{
  long lVar1;
  pointer ppVar2;
  pointer __s2;
  size_t sVar3;
  size_t __n;
  int iVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  size_type *psVar8;
  bool bVar9;
  
  ppVar2 = (this->fields).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Type_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Type_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar5 = (long)(this->fields).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Type_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Type_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2;
  bVar9 = lVar5 != 0;
  if (bVar9) {
    lVar5 = lVar5 >> 3;
    uVar6 = lVar5 * -0x3333333333333333;
    __s2 = (field_name->_M_dataplus)._M_p;
    sVar3 = field_name->_M_string_length;
    psVar8 = &(ppVar2->first)._M_string_length;
    uVar7 = 1;
    do {
      __n = *psVar8;
      if (__n == sVar3) {
        if (__n == 0) {
          return bVar9;
        }
        iVar4 = bcmp((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (psVar8 + -1))->_M_dataplus)._M_p,__s2,__n);
        if (iVar4 == 0) {
          return bVar9;
        }
      }
      bVar9 = uVar7 < uVar6;
      lVar1 = uVar7 + (lVar5 * 0x3333333333333333 - (ulong)(uVar6 == 0));
      uVar7 = uVar7 + 1;
      psVar8 = psVar8 + 5;
    } while (lVar1 != 0);
  }
  return bVar9;
}

Assistant:

bool has_field(const std::string& field_name) const {
		for (std::size_t i = 0; i < fields.size(); ++i) {
			if (fields[i].first == field_name) {
				return true;
			}
		}
		return false;
	}